

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double> *
__thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>::
operator=(Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
          *this,Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                *other)

{
  const_iterator first;
  const_iterator last;
  const_iterator local_48;
  const_iterator local_30;
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  *local_18;
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  *other_local;
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  *this_local;
  
  if (this != other) {
    local_18 = other;
    other_local = this;
    clear(this);
    begin(&local_30,local_18);
    end(&local_48,local_18);
    first.it_.m_ = local_30.it_.m_;
    first.it_.node_ = local_30.it_.node_;
    first.it_.bucket_index_ = local_30.it_.bucket_index_;
    last.it_.m_ = local_48.it_.m_;
    last.it_.node_ = local_48.it_.node_;
    last.it_.bucket_index_ = local_48.it_.bucket_index_;
    Map<std::__cxx11::string,double>::
    insert<google::protobuf::Map<std::__cxx11::string,double>::const_iterator>
              ((Map<std::__cxx11::string,double> *)this,first,last);
  }
  return this;
}

Assistant:

Map& operator=(const Map& other) {
    if (this != &other) {
      clear();
      insert(other.begin(), other.end());
    }
    return *this;
  }